

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::SetupCustomTargets(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  string emsg;
  string local_58;
  string local_38;
  
  bVar1 = cmsys::SystemTools::MakeDirectory(&(this->Dir).Info,(mode_t *)0x0);
  if (bVar1) {
    if (((this->Moc).super_GenVarsT.Enabled != false) ||
       (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
      bVar1 = SetupWriteAutogenInfo(this);
      if (!bVar1) goto LAB_0034b884;
    }
    bVar1 = true;
    if ((this->Rcc).super_GenVarsT.Enabled == true) {
      bVar1 = SetupWriteRccInfo(this);
      return bVar1;
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"AutoGen: Could not create directory: ","");
    cmQtAutoGen::Quoted(&local_38,&(this->Dir).Info);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::Error(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
LAB_0034b884:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmQtAutoGenInitializer::SetupCustomTargets()
{
  // Create info directory on demand
  if (!cmSystemTools::MakeDirectory(this->Dir.Info)) {
    std::string emsg = ("AutoGen: Could not create directory: ");
    emsg += Quoted(this->Dir.Info);
    cmSystemTools::Error(emsg);
    return false;
  }

  // Generate autogen target info file
  if (this->MocOrUicEnabled()) {
    // Write autogen target info files
    if (!this->SetupWriteAutogenInfo()) {
      return false;
    }
  }

  // Write AUTORCC info files
  return !this->Rcc.Enabled || this->SetupWriteRccInfo();
}